

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArtificialPopulation.cpp
# Opt level: O1

void __thiscall ArtificialPopulation::update(ArtificialPopulation *this)

{
  _func_int **pp_Var1;
  ANN *this_00;
  double *__ptr;
  long lVar2;
  Index IVar3;
  Index IVar4;
  Event *pEVar5;
  Clock *this_01;
  long lVar6;
  double dVar7;
  double dVar8;
  MatrixXd local_60;
  DenseStorage<double,__1,__1,__1,_0> local_48;
  
  dVar8 = (this->super_Population).current_time;
  dVar7 = Clock::getCurrentTime((this->super_Population).clock);
  if (dVar8 < dVar7) {
    do {
      Population::resetOutput(&this->super_Population);
      this_00 = this->ann;
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
                (&local_48,(DenseStorage<double,__1,__1,__1,_0> *)&this->annInput);
      ANN::predict(&local_60,this_00,(MatrixXd *)&local_48);
      __ptr = (this->annOutput).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_data;
      (this->annOutput).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
      m_data = local_60.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
               m_data;
      IVar3 = (this->annOutput).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_rows;
      IVar4 = (this->annOutput).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_cols;
      (this->annOutput).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
      m_rows = local_60.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
               m_rows;
      (this->annOutput).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
      m_cols = local_60.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
               m_cols;
      local_60.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
           __ptr;
      local_60.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
           IVar3;
      local_60.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
           IVar4;
      free(__ptr);
      free(local_48.m_data);
      if (0 < (this->super_Population).numberOfOutputNeurons) {
        lVar6 = 0;
        do {
          pEVar5 = (Event *)operator_new(0x20);
          lVar2 = (this->annOutput).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                  .m_storage.m_rows;
          if ((lVar2 < 1) ||
             ((this->annOutput).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_cols <= lVar6)) {
LAB_0010ff80:
            __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/haukri[P]MasterProject/Eigen/src/Core/DenseCoeffsBase.h"
                          ,0x16d,
                          "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>, Level = 1]"
                         );
          }
          pp_Var1 = (_func_int **)
                    (this->annOutput).
                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                    m_data[lVar2 * lVar6];
          pEVar5->_vptr_Event = (_func_int **)&PTR_setWeight_0011ccd8;
          pEVar5[1]._vptr_Event = (_func_int **)0x0;
          pEVar5->type = Value;
          this_01 = Clock::getInstance();
          dVar8 = Clock::getCurrentTime(this_01);
          pEVar5->eventTime = dVar8;
          pEVar5[1]._vptr_Event = pp_Var1;
          (this->super_Population).output.super__Vector_base<Event_*,_std::allocator<Event_*>_>.
          _M_impl.super__Vector_impl_data._M_start[lVar6] = pEVar5;
          lVar2 = (this->annOutput).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                  .m_storage.m_rows;
          if ((lVar2 < 1) ||
             ((this->annOutput).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_cols <= lVar6)) goto LAB_0010ff80;
          Logging::logValue((this->super_Population).logger,(long)this,(int)lVar6,3,
                            (this->annOutput).
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                            m_storage.m_data[lVar2 * lVar6]);
          lVar6 = lVar6 + 1;
        } while (lVar6 < (this->super_Population).numberOfOutputNeurons);
      }
      dVar8 = Clock::getDt((this->super_Population).clock);
      dVar8 = dVar8 + (this->super_Population).current_time;
      (this->super_Population).current_time = dVar8;
      dVar7 = Clock::getCurrentTime((this->super_Population).clock);
    } while (dVar8 < dVar7);
  }
  return;
}

Assistant:

void ArtificialPopulation::update() {
    while(current_time < clock->getCurrentTime()) {
        resetOutput();
        annOutput = ann->predict(annInput);
        for(int i = 0; i < numberOfOutputNeurons; i++) {
            output[i] = new ValueEvent(annOutput(0, i));
            logger->logValue((long)this, i, EventType::Value, annOutput(0, i));
        }
        current_time += clock->getDt();
    }
}